

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall basisu::basisu_frontend::init_endpoint_training_vectors(basisu_frontend *this)

{
  uint uVar1;
  uint uVar2;
  job_pool *this_00;
  uint uVar3;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  array_of_weighted_training_vecs *local_38;
  
  debug_printf("init_endpoint_training_vectors\n");
  local_38 = &(this->m_endpoint_clusterizer).m_training_vecs;
  vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_>::resize
            (local_38,(ulong)(this->m_total_blocks * 2),false);
  uVar3 = 0;
  while (uVar2 = this->m_total_blocks, uVar3 < uVar2) {
    this_00 = (this->m_params).m_pJob_pool;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x18);
    uVar1 = uVar3 + 0x4000;
    if (uVar1 <= uVar2) {
      uVar2 = uVar1;
    }
    *(basisu_frontend **)local_58._M_unused._0_8_ = this;
    *(uint *)((long)local_58._M_unused._0_8_ + 8) = uVar3;
    *(uint *)((long)local_58._M_unused._0_8_ + 0xc) = uVar2;
    *(array_of_weighted_training_vecs **)((long)local_58._M_unused._0_8_ + 0x10) = local_38;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:863:35)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:863:35)>
               ::_M_manager;
    job_pool::add_job(this_00,(function<void_()> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    uVar3 = uVar1;
  }
  job_pool::wait_for_all((this->m_params).m_pJob_pool);
  return;
}

Assistant:

void basisu_frontend::init_endpoint_training_vectors()
	{
		debug_printf("init_endpoint_training_vectors\n");
								
		vec6F_quantizer::array_of_weighted_training_vecs &training_vecs = m_endpoint_clusterizer.get_training_vecs();
		
		training_vecs.resize(m_total_blocks * 2);

		const uint32_t N = 16384;
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job( [this, first_index, last_index, &training_vecs] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{			
					const etc_block &blk = m_etc1_blocks_etc1s[block_index];

					color_rgba block_colors[2];
					blk.get_block_low_high_colors(block_colors, 0);
				
					vec6F v;
					v[0] = block_colors[0].r * (1.0f / 255.0f);
					v[1] = block_colors[0].g * (1.0f / 255.0f);
					v[2] = block_colors[0].b * (1.0f / 255.0f);
					v[3] = block_colors[1].r * (1.0f / 255.0f);
					v[4] = block_colors[1].g * (1.0f / 255.0f);
					v[5] = block_colors[1].b * (1.0f / 255.0f);
				
					training_vecs[block_index * 2 + 0] = std::make_pair(v, 1);
					training_vecs[block_index * 2 + 1] = std::make_pair(v, 1);

				} // block_index;

#ifndef __EMSCRIPTEN__
			} );
#endif

		} // block_index_iter

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif
	}